

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

void Omega_h::write_reals_txt(ostream *stream,Reals *a,Int ncomps)

{
  Alloc *pAVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  Int j;
  ulong uVar9;
  ulong uVar10;
  HostRead<double> h_a;
  Write<double> local_40;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar7 = pAVar1->size;
  }
  else {
    sVar7 = (ulong)pAVar1 >> 3;
  }
  uVar4 = divide_no_remainder<int>((int)(sVar7 >> 3),ncomps);
  Write<double>::Write(&local_40,&a->write_);
  HostRead<double>::HostRead(&h_a,(Read<signed_char> *)&local_40);
  Write<double>::~Write(&local_40);
  lVar2 = *(long *)stream;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(stream + lVar3 + 0x18) = *(uint *)(stream + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(stream + *(long *)(lVar2 + -0x18) + 8) = 0x11;
  uVar8 = 0;
  uVar6 = 0;
  if (0 < ncomps) {
    uVar6 = (ulong)(uint)ncomps;
  }
  uVar9 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar9 = uVar8;
  }
  for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
    for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      std::ostream::_M_insert<double>
                (*(double *)((long)h_a.read_.write_.shared_alloc_.direct_ptr + uVar10 * 8 + uVar8));
      if ((long)uVar10 < (long)(ncomps + -1)) {
        std::operator<<(stream,' ');
      }
    }
    std::operator<<(stream,'\n');
    uVar8 = uVar8 + (long)ncomps * 8;
  }
  Write<double>::~Write((Write<double> *)&h_a);
  return;
}

Assistant:

void write_reals_txt(std::ostream& stream, Reals a, Int ncomps) {
  auto n = divide_no_remainder(a.size(), ncomps);
  auto h_a = HostRead<Real>(a);
  stream << std::scientific << std::setprecision(17);
  for (LO i = 0; i < n; ++i) {
    for (Int j = 0; j < ncomps; ++j) {
      stream << h_a[i * ncomps + j];
      if (j < ncomps - 1) stream << ' ';
    }
    stream << '\n';
  }
}